

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_sub_complex.h
# Opt level: O2

Vertex_handle __thiscall
Gudhi::skeleton_blocker::
Skeleton_blocker_sub_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
::add_vertex(Skeleton_blocker_sub_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
             *this,Root_vertex_handle global)

{
  size_t *psVar1;
  bool bVar2;
  vertex_descriptor vVar3;
  Graph_vertex *pGVar4;
  Vertex_handle address;
  int local_24;
  pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
  local_20;
  
  bVar2 = Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
          contains_vertex(&this->
                           super_Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>
                          ,(Root_vertex_handle)global.vertex);
  if (!bVar2) {
    vVar3 = boost::
            add_vertex<boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,boost::no_property,boost::listS>,boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,boost::no_property,boost::listS>,boost::vecS,boost::setS,boost::undirectedS,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,boost::no_property,boost::listS>,boost::vecS,boost::setS,boost::undirectedS,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,boost::no_property,boost::listS>::config>>
                      (&(this->
                        super_Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>
                        ).skeleton.super_type);
    psVar1 = &(this->
              super_Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>
              ).num_vertices_;
    *psVar1 = *psVar1 + 1;
    address.vertex = (boost_vertex_handle)vVar3;
    pGVar4 = Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
             operator[](&this->
                         super_Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>
                        ,address);
    pGVar4->is_active_ = true;
    pGVar4 = Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
             operator[](&this->
                         super_Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>
                        ,address);
    (pGVar4->id_).vertex = global.vertex;
    local_20.first.vertex = global.vertex;
    local_20.second.vertex = address.vertex;
    std::
    _Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle,std::pair<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle_const,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,std::_Select1st<std::pair<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle_const,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>>,std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle>,std::allocator<std::pair<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle_const,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>>>
    ::
    _M_insert_unique<std::pair<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle_const,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>>
              ((_Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle,std::pair<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle_const,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,std::_Select1st<std::pair<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle_const,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>>,std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle>,std::allocator<std::pair<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle_const,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>>>
                *)&this->addresses,&local_20);
    local_24 = 0;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&(this->
                super_Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>
                ).degree_,&local_24);
    return (Vertex_handle)address.vertex;
  }
  __assert_fail("!this->contains_vertex(global)",
                "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Skeleton_blocker/include/gudhi/Skeleton_blocker/Skeleton_blocker_sub_complex.h"
                ,0x55,
                "Vertex_handle Gudhi::skeleton_blocker::Skeleton_blocker_sub_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>>::add_vertex(Root_vertex_handle) [ComplexType = Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>]"
               );
}

Assistant:

Vertex_handle add_vertex(Root_vertex_handle global) {
    assert(!this->contains_vertex(global));
    Vertex_handle address(boost::add_vertex(this->skeleton));
    this->num_vertices_++;
    (*this)[address].activate();
    (*this)[address].set_id(global);
    addresses.insert(AddressPair(global, address));
    this->degree_.push_back(0);
    return address;
  }